

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.c
# Opt level: O2

void worker(void *arg)

{
  int line;
  int iVar1;
  int in_ECX;
  int in_EDX;
  int sock;
  int in_ESI;
  undefined8 uStack_20;
  char buf [3];
  
  line = test_socket_impl((char *)0x24,in_ESI,in_EDX,in_ECX);
  iVar1 = nn_recv(line,buf,3,0);
  if (iVar1 == -1) {
    iVar1 = nn_errno();
    if (iVar1 == 0x9523dfd) {
      iVar1 = nn_recv(line,buf,3,0);
      if (iVar1 == -1) {
        iVar1 = nn_errno();
        if (iVar1 == 0x9523dfd) {
          test_close_impl((char *)0x2e,line,sock);
          return;
        }
      }
      uStack_20 = 0x2d;
      goto LAB_001016ec;
    }
  }
  uStack_20 = 0x29;
LAB_001016ec:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1 && nn_errno () == ETERM",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c",
          uStack_20);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void worker (NN_UNUSED void *arg)
{
    int rc;
    int s;
    char buf [3];

    /*  Test socket. */
    s = test_socket (AF_SP, NN_PAIR);

    /*  Launch blocking function to check that it will be unblocked once
        nn_term() is called from the main thread. */
    rc = nn_recv (s, buf, sizeof (buf), 0);
    nn_assert (rc == -1 && nn_errno () == ETERM);

    /*  Check that all subsequent operations fail in synchronous manner. */
    rc = nn_recv (s, buf, sizeof (buf), 0);
    nn_assert (rc == -1 && nn_errno () == ETERM);
    test_close (s);
}